

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode resolve_host(Curl_easy *data,connectdata *conn,_Bool *async)

{
  undefined8 uVar1;
  connectdata *data_00;
  resolve_t rVar2;
  timediff_t tVar3;
  char *pcVar4;
  curltime cVar5;
  curltime newer;
  undefined4 local_64;
  _Bool *local_60;
  int rc;
  timediff_t timeout_ms;
  hostname *connhost;
  Curl_dns_entry *hostaddr;
  _Bool *async_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  connhost = (hostname *)0x0;
  hostaddr = (Curl_dns_entry *)async;
  async_local = (_Bool *)conn;
  conn_local = (connectdata *)data;
  tVar3 = Curl_timeleft(data,(curltime *)0x0,true);
  if ((*(uint *)(async_local + 0x374) >> 9 & 1) == 0) {
    local_60 = async_local + 0x88;
  }
  else {
    local_60 = async_local + 0xb8;
  }
  if ((*(uint *)(async_local + 0x374) >> 10 & 1) == 0) {
    local_64 = *(undefined4 *)(async_local + 0x56c);
  }
  else {
    local_64 = *(undefined4 *)(async_local + 0x570);
  }
  *(undefined4 *)(async_local + 0x568) = local_64;
  pcVar4 = (*Curl_cstrdup)(*(char **)(local_60 + 0x10));
  *(char **)(async_local + 0xa8) = pcVar4;
  if (*(long *)(async_local + 0xa8) == 0) {
    return CURLE_OUT_OF_MEMORY;
  }
  rVar2 = Curl_resolv_timeout((Curl_easy *)conn_local,*(char **)(async_local + 0xa8),
                              *(int *)(async_local + 0x568),(Curl_dns_entry **)&connhost,tVar3);
  data_00 = conn_local;
  *(hostname **)(async_local + 0x68) = connhost;
  if (rVar2 == CURLRESOLV_PENDING) {
    *(undefined1 *)&hostaddr->addr = 1;
  }
  else {
    if (rVar2 == CURLRESOLV_TIMEDOUT) {
      uVar1 = *(undefined8 *)(local_60 + 0x18);
      cVar5 = Curl_now();
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar5._0_12_,0);
      newer.tv_usec = SUB124(cVar5._0_12_,8);
      cVar5._12_4_ = 0;
      cVar5._0_12_ = *(undefined1 (*) [12])&conn_local[2].bundle_node.next;
      tVar3 = Curl_timediff(newer,cVar5);
      Curl_failf((Curl_easy *)data_00,"Failed to resolve host \'%s\' with timeout after %ld ms",
                 uVar1,tVar3);
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (connhost == (hostname *)0x0) {
      Curl_failf((Curl_easy *)conn_local,"Could not resolve host: %s",
                 *(undefined8 *)(local_60 + 0x18));
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode resolve_host(struct Curl_easy *data,
                             struct connectdata *conn,
                             bool *async)
{
  struct Curl_dns_entry *hostaddr = NULL;
  struct hostname *connhost;
  timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);
  int rc;

  DEBUGASSERT(conn->dns_entry == NULL);

  connhost = conn->bits.conn_to_host ? &conn->conn_to_host : &conn->host;

  /* If not connecting via a proxy, extract the port from the URL, if it is
   * there, thus overriding any defaults that might have been set above. */
  conn->port = conn->bits.conn_to_port ? conn->conn_to_port :
    conn->remote_port;

  /* Resolve target host right on */
  conn->hostname_resolve = strdup(connhost->name);
  if(!conn->hostname_resolve)
    return CURLE_OUT_OF_MEMORY;

  rc = Curl_resolv_timeout(data, conn->hostname_resolve, (int)conn->port,
                           &hostaddr, timeout_ms);
  conn->dns_entry = hostaddr;
  if(rc == CURLRESOLV_PENDING)
    *async = TRUE;
  else if(rc == CURLRESOLV_TIMEDOUT) {
    failf(data, "Failed to resolve host '%s' with timeout after %ld ms",
          connhost->dispname,
          Curl_timediff(Curl_now(), data->progress.t_startsingle));
    return CURLE_OPERATION_TIMEDOUT;
  }
  else if(!hostaddr) {
    failf(data, "Could not resolve host: %s", connhost->dispname);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  return CURLE_OK;
}